

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall spvtools::val::ValidationState_t::IsPointerType(ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  bool bVar2;
  Instruction *pIVar3;
  
  if (id == 0) {
    bVar2 = false;
  }
  else {
    pIVar3 = FindDef(this,id);
    if (pIVar3 == (Instruction *)0x0) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x4b7,"bool spvtools::val::ValidationState_t::IsPointerType(uint32_t) const");
    }
    uVar1 = (pIVar3->inst_).opcode;
    bVar2 = uVar1 == 0x1141 || uVar1 == 0x20;
  }
  return bVar2;
}

Assistant:

bool ValidationState_t::IsPointerType(uint32_t id) const {
  if (!id) return false;
  const Instruction* inst = FindDef(id);
  assert(inst);
  return inst->opcode() == spv::Op::OpTypePointer ||
         inst->opcode() == spv::Op::OpTypeUntypedPointerKHR;
}